

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O0

Matrix<int> __thiscall Matrix<int>::operator+(Matrix<int> *this,Matrix<int> *M1)

{
  uint uVar1;
  int *in_RDX;
  int **extraout_RDX;
  int **extraout_RDX_00;
  Matrix<int> MVar3;
  int local_2c;
  int local_28;
  int j;
  int i;
  Matrix<int> *M1_local;
  Matrix<int> *this_local;
  Matrix<int> *add;
  int **ppiVar2;
  
  if ((M1->n == *in_RDX) && (M1->m == in_RDX[1])) {
    Matrix(this,M1->n,M1->m);
    ppiVar2 = extraout_RDX_00;
    for (local_28 = 0; local_28 < M1->n; local_28 = local_28 + 1) {
      for (local_2c = 0; local_2c < M1->m; local_2c = local_2c + 1) {
        uVar1 = M1->M[local_28][local_2c] +
                *(int *)(*(long *)(*(long *)(in_RDX + 2) + (long)local_28 * 8) + (long)local_2c * 4)
        ;
        ppiVar2 = (int **)(ulong)uVar1;
        this->M[local_28][local_2c] = uVar1;
      }
    }
  }
  else {
    Matrix(this);
    ppiVar2 = extraout_RDX;
  }
  MVar3.M = ppiVar2;
  MVar3._0_8_ = this;
  return MVar3;
}

Assistant:

Matrix operator+(const Matrix& M1) const {
    if (n != M1.n || m != M1.m) {
      Matrix<T> Zero;
      return Zero;
    }
    Matrix<T> add(n, m);
    for (int i = 0; i < n; i++) {
      for (int j = 0; j < m; j++) {
        add.M[i][j] = M[i][j] + M1.M[i][j];
      }
    }
    return add;
  }